

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFileInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path,
          WriteMode mode,bool append)

{
  DiskHandle *pDVar1;
  String *pSVar2;
  bool bVar3;
  int iVar4;
  WriteMode WVar5;
  size_t sVar6;
  char *__file;
  AutoCloseFd *t;
  PathPtr PVar7;
  AutoCloseFd local_d8;
  AutoCloseFd result;
  Fault f_1;
  Fault f;
  int error;
  anon_class_40_5_bc53f4ea local_80;
  int local_58;
  int local_54;
  int _kjSyscallError;
  int newFd;
  String filename;
  mode_t acl;
  uint flags;
  bool append_local;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  filename.content.disposer._4_4_ = 0x80002;
  filename.content.disposer._0_4_ = 0x1b6;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  bVar3 = has<kj::WriteMode,void>(mode,CREATE);
  if (bVar3) {
    filename.content.disposer._4_4_ = filename.content.disposer._4_4_ | 0x40;
  }
  bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
  if (!bVar3) {
    bVar3 = has<kj::WriteMode,void>(mode,CREATE);
    if (!bVar3) {
      Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
      return __return_storage_ptr__;
    }
    filename.content.disposer._4_4_ = filename.content.disposer._4_4_ | 0x80;
  }
  if (append) {
    filename.content.disposer._4_4_ = filename.content.disposer._4_4_ | 0x400;
  }
  bVar3 = has<kj::WriteMode,void>(mode,EXECUTABLE);
  if (bVar3) {
    filename.content.disposer._0_4_ = 0x1ff;
  }
  bVar3 = has<kj::WriteMode,void>(mode,PRIVATE);
  if (bVar3) {
    filename.content.disposer._0_4_ = (uint)filename.content.disposer & 0x1c0;
  }
  PathPtr::toString((String *)&_kjSyscallError,(PathPtr *)&this_local,false);
  local_80.newFd = &local_54;
  local_80.flags = (uint *)((long)&filename.content.disposer + 4);
  local_80.acl = (mode_t *)&filename.content.disposer;
  local_80.this = this;
  local_80.filename = (String *)&_kjSyscallError;
  iVar4 = _::Debug::
          syscallError<kj::(anonymous_namespace)::DiskHandle::tryOpenFileInternal(kj::PathPtr,kj::WriteMode,bool)const::_lambda()_1_>
                    (&local_80,false);
  local_58 = iVar4;
  if (iVar4 == 0) {
    AutoCloseFd::AutoCloseFd(&local_d8,local_54);
    t = mv<kj::AutoCloseFd>(&local_d8);
    Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,t);
    AutoCloseFd::~AutoCloseFd(&local_d8);
  }
  else if (iVar4 == 2) {
    bVar3 = has<kj::WriteMode,void>(mode,CREATE);
    if (bVar3) {
      bVar3 = has<kj::WriteMode,void>(mode,CREATE_PARENT);
      if ((bVar3) && (sVar6 = PathPtr::size((PathPtr *)&this_local), sVar6 != 0)) {
        PVar7 = PathPtr::parent((PathPtr *)&this_local);
        WVar5 = operator|(CREATE,MODIFY);
        WVar5 = operator|(WVar5,CREATE_PARENT);
        bVar3 = tryMkdir(this,PVar7,WVar5,true);
        pSVar2 = path_local.parts.ptr;
        pDVar1 = this_local;
        if (bVar3) {
          WVar5 = operator-(mode,CREATE_PARENT);
          PVar7.parts.size_ = (size_t)pSVar2;
          PVar7.parts.ptr = (String *)pDVar1;
          tryOpenFileInternal(__return_storage_ptr__,this,PVar7,WVar5,append);
          goto LAB_0060bf05;
        }
      }
      bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
      if (!bVar3) {
        iVar4 = AutoCloseFd::operator_cast_to_int(&this->fd);
        __file = String::cStr((String *)&_kjSyscallError);
        iVar4 = faccessat(iVar4,__file,0,0x100);
        if (-1 < iVar4) {
          Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
          goto LAB_0060bf05;
        }
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x401,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                 (char (*) [26])"parent is not a directory",(PathPtr *)&this_local);
      Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
      _::Debug::Fault::~Fault(&f_1);
    }
    else {
      Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
    }
  }
  else {
    if (iVar4 == 0x11) {
      bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
      if (!bVar3) {
        Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
        goto LAB_0060bf05;
      }
    }
    else if ((iVar4 == 0x14) && (bVar3 = has<kj::WriteMode,void>(mode,CREATE), !bVar3)) {
      Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
      goto LAB_0060bf05;
    }
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x414,iVar4,"openat(fd, path, O_RDWR | ...)","path",(PathPtr *)&this_local);
    Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
    _::Debug::Fault::~Fault((Fault *)&result);
  }
LAB_0060bf05:
  String::~String((String *)&_kjSyscallError);
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return nullptr;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return nullptr;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return nullptr; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return nullptr;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return nullptr;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return nullptr;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }